

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::switch_modes(Application *this,uint key)

{
  if (key == 0x41) {
LAB_0019d272:
    to_animate_mode(this);
    goto LAB_0019d298;
  }
  if (key == 0x4d) {
LAB_0019d286:
    to_model_mode(this);
  }
  else {
    if (key != 0x52) {
      if ((key == 0x56) || (key == 0x76)) {
        to_visualize_mode(this);
        goto LAB_0019d298;
      }
      if (key == 0x6d) goto LAB_0019d286;
      if (key != 0x72) {
        if (key != 0x61) {
          return;
        }
        goto LAB_0019d272;
      }
    }
    to_render_mode(this);
  }
LAB_0019d298:
  setupElementTransformWidget(this);
  return;
}

Assistant:

void Application::switch_modes(unsigned int key) {
  switch (key) {
    case 'a':
    case 'A':
      to_animate_mode();
      setupElementTransformWidget();
      break;
    case 'm':
    case 'M':
      to_model_mode();
      setupElementTransformWidget();
      break;
    case 'r':
    case 'R':
      to_render_mode();
      setupElementTransformWidget();
      break;
    case 'v':
    case 'V':
      to_visualize_mode();
      setupElementTransformWidget();
      break;
    default:
      break;
  }
}